

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O1

DdNode * cuddUniqueConst(DdManager *unique,double value)

{
  uint *puVar1;
  DdNode **ppDVar2;
  uint uVar3;
  DdNode *pDVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  uVar3 = (unique->constants).keys;
  if ((unique->constants).maxKeys < uVar3) {
    if ((unique->gcEnabled == 0) ||
       ((unique->dead <= unique->minDead && ((unique->constants).dead * 10 <= uVar3 * 9)))) {
      cuddRehash(unique,0x7fffffff);
    }
    else {
      cuddGarbageCollect(unique,1);
    }
  }
  dVar7 = (double)(~-(ulong)(value < 1e+151) & 0x7ea2aa4f4a405be2 |
                  (~-(ulong)(value <= -1e+151) & (ulong)value |
                  -(ulong)(value <= -1e+151) & 0xfea2aa4f4a405be2) & -(ulong)(value < 1e+151));
  dVar5 = -dVar7;
  if (-dVar7 <= dVar7) {
    dVar5 = dVar7;
  }
  dVar7 = (double)(~-(ulong)(dVar5 < unique->epsilon) & (ulong)dVar7);
  uVar3 = (uint)(((int)((ulong)dVar7 >> 0x20) + SUB84(dVar7,0) * 0xc00005) * 0x40f1f9) >>
          ((byte)(unique->constants).shift & 0x1f);
  ppDVar2 = (unique->constants).nodelist;
  pDVar4 = ppDVar2[(int)uVar3];
  while( true ) {
    if (pDVar4 == (DdNode *)0x0) {
      unique->keys = unique->keys + 1;
      puVar1 = &(unique->constants).keys;
      *puVar1 = *puVar1 + 1;
      pDVar4 = cuddAllocNode(unique);
      if (pDVar4 == (DdNode *)0x0) {
        pDVar4 = (DdNode *)0x0;
      }
      else {
        pDVar4->index = 0x7fffffff;
        (pDVar4->type).value = dVar7;
        pDVar4->next = ppDVar2[(int)uVar3];
        ppDVar2[(int)uVar3] = pDVar4;
      }
      return pDVar4;
    }
    dVar5 = (pDVar4->type).value;
    if ((dVar5 == dVar7) && (!NAN(dVar5) && !NAN(dVar7))) break;
    dVar5 = dVar5 - dVar7;
    dVar6 = -dVar5;
    if (-dVar5 <= dVar5) {
      dVar6 = dVar5;
    }
    if (dVar6 < unique->epsilon) break;
    pDVar4 = pDVar4->next;
  }
  if (pDVar4->ref != 0) {
    return pDVar4;
  }
  cuddReclaim(unique,pDVar4);
  return pDVar4;
}

Assistant:

DdNode *
cuddUniqueConst(
  DdManager * unique,
  CUDD_VALUE_TYPE  value)
{
    int pos;
    DdNodePtr *nodelist;
    DdNode *looking;
    hack split;

#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps++;
#endif

    if (unique->constants.keys > unique->constants.maxKeys) {
        if (unique->gcEnabled && ((unique->dead > unique->minDead) ||
        (10 * unique->constants.dead > 9 * unique->constants.keys))) {  /* too many dead */
            (void) cuddGarbageCollect(unique,1);
        } else {
            cuddRehash(unique,CUDD_CONST_INDEX);
        }
    }

    cuddAdjust(value); /* for the case of crippled infinities */

    if (ddAbs(value) < unique->epsilon) {
        value = 0.0;
    }
    split.value = value;

    pos = ddHash(split.bits[0], split.bits[1], unique->constants.shift);
    nodelist = unique->constants.nodelist;
    looking = nodelist[pos];

    /* Here we compare values both for equality and for difference less
     * than epsilon. The first comparison is required when values are
     * infinite, since Infinity - Infinity is NaN and NaN < X is 0 for
     * every X.
     */
    while (looking != NULL) {
        if (looking->type.value == value ||
        ddEqualVal(looking->type.value,value,unique->epsilon)) {
            if (looking->ref == 0) {
                cuddReclaim(unique,looking);
            }
            return(looking);
        }
        looking = looking->next;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }

    unique->keys++;
    unique->constants.keys++;

    looking = cuddAllocNode(unique);
    if (looking == NULL) return(NULL);
    looking->index = CUDD_CONST_INDEX;
    looking->type.value = value;
    looking->next = nodelist[pos];
    nodelist[pos] = looking;

    return(looking);

}